

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Node * prvTidyGetToken(TidyDocImpl *doc,GetTokenMode mode)

{
  uint *puVar1;
  int *piVar2;
  TidyTagId TVar3;
  uint uVar4;
  uint uVar5;
  Lexer *lexer;
  ctmbstr ptVar6;
  AttVal *pAVar7;
  Lexer *lexer_00;
  Dict *pDVar8;
  byte bVar9;
  tmbchar tVar10;
  uint uVar11;
  int iVar12;
  Bool BVar13;
  uint uVar14;
  int iVar15;
  Node *pNVar16;
  ulong uVar17;
  tmbstr ptVar18;
  AttVal *pAVar19;
  Attribute *pAVar20;
  AttVal *pAVar21;
  NodeType type;
  StreamIn *pSVar22;
  ulong uVar23;
  Node *unaff_R12;
  uint uVar24;
  bool bVar25;
  Bool isempty;
  Node *php;
  Node *asp;
  AttVal *local_78;
  int local_6c;
  Bool local_5c;
  undefined8 local_58;
  int local_4c;
  AttVal *local_48;
  Node *local_40;
  Node *local_38;
  
  lexer = doc->lexer;
  if ((lexer->pushed != no) || (lexer->itoken != (Node *)0x0)) {
    if (lexer->itoken != (Node *)0x0) {
      if (lexer->pushed != no) {
        lexer->pushed = no;
        return lexer->itoken;
      }
      lexer->itoken = (Node *)0x0;
    }
    lexer->pushed = no;
    pNVar16 = lexer->token;
    if (pNVar16->type == TextNode) {
      if ((lexer->insert == (IStack *)0x0) && (lexer->inode == (Node *)0x0)) {
        return pNVar16;
      }
      pNVar16 = prvTidyInsertedToken(doc);
      lexer->itoken = pNVar16;
      return pNVar16;
    }
    return pNVar16;
  }
  if (((lexer->insert != (IStack *)0x0) || (lexer->inode != (Node *)0x0)) &&
     (lexer->istacksize != 0)) {
    pNVar16 = prvTidyInsertedToken(doc);
LAB_001493b1:
    lexer->token = pNVar16;
    return pNVar16;
  }
  if (mode == CdataContent) {
    pNVar16 = lexer->parent;
    if (pNVar16 == (Node *)0x0) {
      __assert_fail("lexer->parent != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/lexer.c"
                    ,0x9cc,"Node *prvTidyGetToken(TidyDocImpl *, GetTokenMode)");
    }
    local_48 = prvTidyAttrGetById(pNVar16,TidyAttr_SRC);
    if ((pNVar16->tag == (Dict *)0x0) ||
       ((TVar3 = pNVar16->tag->id, TVar3 != TidyTag_STYLE && (TVar3 != TidyTag_SCRIPT)))) {
      local_58 = (tmbstr)((ulong)local_58._4_4_ << 0x20);
    }
    else {
      local_58 = (tmbstr)CONCAT44(local_58._4_4_,
                                  CONCAT31((int3)(TVar3 >> 8),
                                           *(int *)((doc->config).value + 0x4f) != 0));
    }
    pSVar22 = doc->docIn;
    lexer->lines = pSVar22->curline;
    lexer->columns = pSVar22->curcol;
    lexer->waswhite = no;
    lexer->txtend = lexer->lexsize;
    lexer->txtstart = lexer->lexsize;
    uVar11 = prvTidyReadChar(pSVar22);
    bVar25 = uVar11 == 0xffffffff;
    if (bVar25) {
      local_78._0_4_ = 1;
    }
    else {
      local_78._0_4_ = 1;
      bVar25 = false;
      uVar24 = 0;
      iVar12 = 0;
      local_6c = 0;
      do {
        prvTidyAddCharToLexer(lexer,uVar11);
        lexer->txtend = lexer->lexsize;
        if (iVar12 == 1) {
          if ((0x7f < uVar11) || (iVar12 = 1, (lexmap[uVar11] & 2) == 0)) {
            ptVar6 = pNVar16->element;
            ptVar18 = lexer->lexbuf;
            uVar11 = prvTidytmbstrlen(ptVar6);
            iVar12 = prvTidytmbstrncasecmp(ptVar6,ptVar18 + uVar24,uVar11);
            local_6c = local_6c + (uint)(((byte)local_58 ^ 1) & iVar12 == 0);
LAB_0014975f:
            iVar12 = 0;
          }
        }
        else if (iVar12 == 0) {
          if (uVar11 == 0x3c) {
            uVar11 = prvTidyReadChar(doc->docIn);
            if ((0x7f < uVar11) || ((lexmap[uVar11] & 2) == 0)) {
              if (uVar11 == 0x5c) {
                prvTidyAddCharToLexer(lexer,0x5c);
                uVar11 = prvTidyReadChar(doc->docIn);
                if (uVar11 == 0x2f) {
                  prvTidyAddCharToLexer(lexer,0x2f);
                  iVar12 = 0;
                  if ((char)local_58 == '\0') {
                    uVar11 = prvTidyReadChar(doc->docIn);
                    if ((uVar11 < 0x80) && ((lexmap[uVar11] & 2) != 0)) goto LAB_0014952d;
                    prvTidyUngetChar(uVar11,doc->docIn);
                  }
                  goto LAB_00149762;
                }
              }
              else if (uVar11 == 0x2f) {
                prvTidyAddCharToLexer(lexer,0x2f);
                uVar11 = prvTidyReadChar(doc->docIn);
                if ((uVar11 < 0x80) && ((lexmap[uVar11] & 2) != 0)) {
LAB_0014952d:
                  prvTidyUngetChar(uVar11,doc->docIn);
                  uVar24 = lexer->lexsize;
                  iVar12 = 2;
                  goto LAB_00149762;
                }
              }
              prvTidyUngetChar(uVar11,doc->docIn);
              goto LAB_0014975f;
            }
            if ((((local_48 != (AttVal *)0x0) && ((uint)local_78 != 0)) &&
                (pNVar16->tag != (Dict *)0x0)) && (pNVar16->tag->id == TidyTag_SCRIPT)) {
              lexer->lexsize = lexer->txtstart;
              prvTidyUngetChar(uVar11,doc->docIn);
              prvTidyUngetChar(0x3c,doc->docIn);
              return (Node *)0x0;
            }
            prvTidyAddCharToLexer(lexer,uVar11);
            uVar24 = lexer->lexsize - 1;
            iVar12 = 1;
          }
          else {
            iVar12 = 0;
            if ((uVar11 < 0x80) && ((uint)local_78 != 0)) {
              local_78._0_4_ = lexmap[uVar11] >> 3 & 1;
            }
            else {
              local_78._0_4_ = 0;
            }
          }
        }
        else if ((0x7f < uVar11) || (iVar12 = 2, (lexmap[uVar11] & 2) == 0)) {
          ptVar6 = pNVar16->element;
          ptVar18 = lexer->lexbuf;
          uVar11 = prvTidytmbstrlen(ptVar6);
          iVar12 = prvTidytmbstrncasecmp(ptVar6,ptVar18 + uVar24,uVar11);
          if (((uint)local_78 != 0) && (iVar12 != 0)) {
            uVar11 = lexer->lexsize;
            while (uVar11 = uVar11 - 1, uVar24 <= uVar11) {
              prvTidyUngetChar((int)lexer->lexbuf[uVar11],doc->docIn);
            }
            prvTidyUngetChar(0x2f,doc->docIn);
            prvTidyUngetChar(0x3c,doc->docIn);
            break;
          }
          if (iVar12 == 0) {
            if (local_6c < 1) {
              uVar11 = lexer->lexsize;
              while (uVar11 = uVar11 - 1, uVar24 <= uVar11) {
                prvTidyUngetChar((int)lexer->lexbuf[uVar11],doc->docIn);
              }
              prvTidyUngetChar(0x2f,doc->docIn);
              prvTidyUngetChar(0x3c,doc->docIn);
              lexer->lexsize = uVar24 - 2;
              break;
            }
            local_6c = local_6c + -1;
          }
          iVar12 = 0;
          if (lexer->lexbuf[uVar24 - 2] != '\\') {
            pSVar22 = doc->docIn;
            lexer->lines = pSVar22->curline;
            lexer->columns = pSVar22->curcol - 3;
            BVar13 = prvTidyIsJavaScript(pNVar16);
            if (((BVar13 != no) && (*(int *)((doc->config).value + 0x1a) != 0)) &&
               (BVar13 = prvTidyIsHTML5Mode(doc), BVar13 == no)) {
              prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x22c);
              uVar17 = (ulong)lexer->lexsize;
              uVar14 = uVar24 - 1;
              if (uVar14 < lexer->lexsize) {
                do {
                  lexer->lexbuf[uVar17] = lexer->lexbuf[uVar17 - 1];
                  uVar17 = uVar17 - 1;
                } while (uVar14 < uVar17);
              }
              lexer->lexbuf[uVar14] = '\\';
              lexer->lexsize = lexer->lexsize + 1;
            }
          }
        }
LAB_00149762:
        uVar11 = prvTidyReadChar(doc->docIn);
        bVar25 = uVar11 == 0xffffffff;
      } while (!bVar25);
    }
    if ((uint)local_78 == 0) {
      lexer->txtend = lexer->lexsize;
    }
    else {
      lexer->txtstart = lexer->txtend;
      lexer->lexsize = lexer->txtend;
    }
    if (bVar25) {
      prvTidyReport(doc,pNVar16,(Node *)0x0,0x25a);
    }
    pNVar16 = (Node *)(*lexer->allocator->vtbl->alloc)(lexer->allocator,0x68);
    pNVar16->parent = (Node *)0x0;
    pNVar16->prev = (Node *)0x0;
    pNVar16->next = (Node *)0x0;
    pNVar16->content = (Node *)0x0;
    pNVar16->last = (Node *)0x0;
    pNVar16->attributes = (AttVal *)0x0;
    pNVar16->was = (Dict *)0x0;
    pNVar16->tag = (Dict *)0x0;
    pNVar16->element = (tmbstr)0x0;
    pNVar16->start = 0;
    pNVar16->end = 0;
    pNVar16->type = RootNode;
    pNVar16->line = 0;
    pNVar16->column = 0;
    pNVar16->closed = no;
    pNVar16->implicit = no;
    pNVar16->linebreak = no;
    pNVar16->line = lexer->lines;
    pNVar16->column = lexer->columns;
    pNVar16->type = TextNode;
    pNVar16->start = lexer->txtstart;
    pNVar16->end = lexer->txtend;
    return pNVar16;
  }
  local_5c = no;
  iVar12 = *(int *)((doc->config).value + 0x1c);
  if (iVar12 == 1) {
    bVar25 = true;
  }
  else if (iVar12 == 0) {
    bVar25 = false;
  }
  else {
    uVar14 = prvTidyHTMLVersion(doc);
    bVar25 = (uVar14 >> 0x11 & 1) == 0;
  }
  lexer->token = (Node *)0x0;
  pSVar22 = doc->docIn;
  lexer->lines = pSVar22->curline;
  lexer->columns = pSVar22->curcol;
  lexer->waswhite = no;
  lexer->txtend = lexer->lexsize;
  lexer->txtstart = lexer->lexsize;
  uVar14 = prvTidyReadChar(pSVar22);
  if (uVar14 == 0xffffffff) {
    local_78 = (AttVal *)0x0;
LAB_0014a345:
    if (lexer->state == LEX_COMMENT) {
      prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x251);
      lexer->txtend = lexer->lexsize;
      lexer->lexbuf[lexer->lexsize] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      type = CommentTag;
LAB_0014a3dc:
      pNVar16 = NewToken(doc,type);
    }
    else {
      if ((lexer->state != LEX_CONTENT) ||
         (lexer->txtend = lexer->lexsize, lexer->lexsize <= lexer->txtstart)) {
        if (local_78 != (AttVal *)0x0) {
          prvTidyFreeAttribute(doc,local_78);
        }
        return (Node *)0x0;
      }
      prvTidyUngetChar(0xffffffff,doc->docIn);
LAB_0014a36d:
      uVar14 = lexer->lexsize - 1;
      if (lexer->lexbuf[uVar14] == ' ') {
        lexer->lexsize = uVar14;
        lexer->txtend = uVar14;
      }
LAB_0014a382:
      pNVar16 = prvTidyTextToken(lexer);
    }
    goto LAB_001493b1;
  }
  iVar12 = 0;
  local_78 = (AttVal *)0x0;
LAB_0014983a:
  if (lexer->insertspace != no) {
    prvTidyAddCharToLexer(lexer,0x20);
    lexer->waswhite = yes;
    lexer->insertspace = no;
  }
  if (mode == Preformatted && uVar14 == 0xa0) {
    uVar14 = 0x20;
  }
  prvTidyAddCharToLexer(lexer,uVar14);
  switch(lexer->state) {
  case LEX_CONTENT:
    if (uVar14 < 0x80) {
      bVar9 = ((byte)lexmap[uVar14] & 8) >> 3;
    }
    else {
      bVar9 = 0;
    }
    if (((mode == IgnoreWhitespace & bVar9) == 1) && (lexer->lexsize == lexer->txtstart + 1)) {
      lexer->lexsize = lexer->lexsize - 1;
      lexer->waswhite = no;
      pSVar22 = doc->docIn;
      lexer->lines = pSVar22->curline;
      lexer->columns = pSVar22->curcol;
      mode = IgnoreWhitespace;
    }
    else if (uVar14 == 0x3c) {
      lexer->state = LEX_GT;
    }
    else if ((uVar14 < 0x80) && ((lexmap[uVar14] & 8) != 0)) {
      if (lexer->waswhite == no) {
        lexer->waswhite = yes;
        if (((mode - OtherNamespace < 0xfffffffe) && (uVar14 != 0x20)) && (lexer->lexsize != 0)) {
          lexer->lexbuf[lexer->lexsize - 1] = ' ';
        }
      }
      else if (mode - OtherNamespace < 0xfffffffe) {
        lexer->lexsize = lexer->lexsize - 1;
        pSVar22 = doc->docIn;
        lexer->lines = pSVar22->curline;
        lexer->columns = pSVar22->curcol;
      }
    }
    else {
      if (mode != IgnoreMarkup && uVar14 == 0x26) {
        ParseEntity(doc,mode);
      }
      mode = mode + (mode == IgnoreWhitespace);
      lexer->waswhite = no;
    }
    break;
  case LEX_GT:
    if (uVar14 == 0x2f) {
      uVar11 = prvTidyReadChar(doc->docIn);
      if (uVar11 == 0xffffffff) {
LAB_00149f35:
        pSVar22 = doc->docIn;
        uVar11 = 0xffffffff;
        goto LAB_0014a28d;
      }
      prvTidyAddCharToLexer(lexer,uVar11);
      if (((uVar11 < 0x80) && ((lexmap[uVar11] & 2) != 0)) ||
         ((*(int *)((doc->config).value + 0x67) != 0 &&
          (BVar13 = prvTidyIsXMLNamechar(uVar11), BVar13 != no)))) {
        uVar24 = lexer->lexsize - 3;
        lexer->lexsize = uVar24;
        lexer->txtend = uVar24;
        prvTidyUngetChar(uVar11,doc->docIn);
        lexer->state = LEX_ENDTAG;
        lexer->lexbuf[lexer->lexsize] = '\0';
        piVar2 = &doc->docIn->curcol;
        *piVar2 = *piVar2 + -2;
        if (lexer->txtstart < lexer->txtend) {
          if (mode != IgnoreWhitespace) goto LAB_0014a382;
          goto LAB_0014a36d;
        }
      }
      else {
        lexer->waswhite = no;
        lexer->state = LEX_CONTENT;
      }
    }
    else if (mode == IgnoreMarkup) {
      lexer->waswhite = no;
      lexer->state = LEX_CONTENT;
      mode = IgnoreMarkup;
    }
    else {
      if ((int)uVar14 < 0x25) {
        if (uVar14 == 0x21) {
          uVar11 = prvTidyReadChar(doc->docIn);
          if (uVar11 == 0x2d) {
            uVar11 = prvTidyReadChar(doc->docIn);
            if (uVar11 != 0x2d) {
LAB_0014a2c8:
              prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x250);
              do {
                uVar11 = prvTidyReadChar(doc->docIn);
                if (uVar11 == 0x3e) goto LAB_0014a302;
              } while (uVar11 != 0xffffffff);
              prvTidyUngetChar(0xffffffff,doc->docIn);
LAB_0014a302:
              uVar14 = lexer->lexsize - 2;
              lexer->lexsize = uVar14;
              lexer->lexbuf[uVar14] = '\0';
              lexer->state = LEX_CONTENT;
              break;
            }
            lexer->state = LEX_COMMENT;
            uVar14 = lexer->lexsize - 2;
            lexer->lexsize = uVar14;
          }
          else {
            if ((uVar11 & 0xffffffdf) == 0x44) {
              lexer->state = LEX_DOCTYPE;
              uVar11 = lexer->lexsize - 2;
              lexer->lexsize = uVar11;
              lexer->txtend = uVar11;
              do {
                uVar11 = prvTidyReadChar(doc->docIn);
                if ((uVar11 == 0xffffffff) || (uVar11 == 0x3e)) goto LAB_0014a18a;
              } while ((0x7f < uVar11) || ((lexmap[uVar11] & 8) == 0));
              do {
                uVar11 = prvTidyReadChar(doc->docIn);
                if (((uVar11 == 0xffffffff) || (uVar11 == 0x3e)) || (0x7f < uVar11)) break;
              } while ((lexmap[uVar11] & 8) != 0);
LAB_0014a18a:
              prvTidyUngetChar(uVar11,doc->docIn);
              uVar14 = lexer->txtstart;
              uVar4 = lexer->txtend;
              if (uVar14 < uVar4) {
                unaff_R12 = prvTidyTextToken(lexer);
                lexer->token = unaff_R12;
              }
              else {
                lexer->txtstart = lexer->lexsize;
              }
              mode = IgnoreWhitespace;
              if (uVar14 < uVar4) {
                return unaff_R12;
              }
              break;
            }
            if (uVar11 != 0x5b) goto LAB_0014a2c8;
            uVar14 = lexer->lexsize - 2;
            lexer->lexsize = uVar14;
            lexer->state = LEX_SECTION;
          }
        }
        else {
          if (uVar14 != 0x23) {
LAB_0014a00c:
            if (((0x7f < uVar14) || ((lexmap[uVar14] & 2) == 0)) &&
               ((*(int *)((doc->config).value + 0x67) == 0 ||
                (BVar13 = prvTidyIsXMLNamechar(uVar14), BVar13 == no)))) {
              prvTidyUngetChar(uVar14,doc->docIn);
              lexer->lexsize = lexer->lexsize - 1;
              lexer->state = LEX_CONTENT;
              lexer->waswhite = no;
              break;
            }
            prvTidyUngetChar(uVar14,doc->docIn);
            prvTidyUngetChar(0x3c,doc->docIn);
            uVar14 = lexer->lexsize - 2;
            lexer->lexsize = uVar14;
            lexer->txtend = uVar14;
            lexer->state = LEX_STARTTAG;
            if (lexer->txtstart < uVar14) goto LAB_0014a382;
            break;
          }
          uVar14 = lexer->lexsize - 2;
          lexer->lexsize = uVar14;
          lexer->state = LEX_JSTE;
        }
      }
      else if (uVar14 == 0x25) {
        uVar14 = lexer->lexsize - 2;
        lexer->lexsize = uVar14;
        lexer->state = LEX_ASP;
      }
      else {
        if (uVar14 != 0x3f) goto LAB_0014a00c;
        uVar14 = lexer->lexsize - 2;
        lexer->lexsize = uVar14;
        lexer->state = LEX_PROCINSTR;
      }
      lexer->txtend = uVar14;
      if (lexer->txtstart < uVar14) goto LAB_0014a382;
      lexer->txtstart = uVar14;
    }
    break;
  case LEX_ENDTAG:
    lexer->txtstart = lexer->lexsize - 1;
    piVar2 = &doc->docIn->curcol;
    *piVar2 = *piVar2 + 2;
    tVar10 = ParseTagName(doc);
    pNVar16 = TagToken(doc,EndTag);
    lexer->token = pNVar16;
    lexer->txtend = lexer->txtstart;
    lexer->lexsize = lexer->txtstart;
    uVar11 = (uint)tVar10;
    while (uVar11 != 0xffffffff) {
      if (uVar11 == 0x3e) goto LAB_0014ae2d;
      uVar11 = prvTidyReadChar(doc->docIn);
    }
    prvTidyFreeNode(doc,lexer->token);
    break;
  case LEX_STARTTAG:
    uVar11 = prvTidyReadChar(doc->docIn);
    if (lexer->lexsize != 0) {
      lexer->lexbuf[lexer->lexsize - 1] = (tmbchar)uVar11;
    }
    lexer->txtstart = lexer->lexsize - 1;
    tVar10 = ParseTagName(doc);
    local_5c = no;
    pNVar16 = TagToken(doc,StartTag);
    lexer->token = pNVar16;
    if (tVar10 == '>') {
      pAVar19 = (AttVal *)0x0;
    }
    else {
      if (tVar10 == '/') {
        prvTidyUngetChar(0x2f,doc->docIn);
      }
      pAVar19 = ParseAttrs(doc,&local_5c);
    }
    if (local_5c != no) {
      lexer->token->type = StartEndTag;
    }
    pNVar16 = lexer->token;
    pNVar16->attributes = pAVar19;
    lexer->txtend = lexer->txtstart;
    lexer->lexsize = lexer->txtstart;
    if (((pNVar16 != (Node *)0x0) && (pNVar16->tag != (Dict *)0x0)) &&
       (pNVar16->tag->id == TidyTag_PRE)) {
      mode = Preformatted;
    }
    if ((((mode != Preformatted) && (pNVar16->type == StartTag)) &&
        ((pNVar16->tag == (Dict *)0x0 || ((pNVar16->tag->model & 1) == 0)))) ||
       (((BVar13 = no, pNVar16 != (Node *)0x0 && (pDVar8 = pNVar16->tag, pDVar8 != (Dict *)0x0)) &&
        ((pDVar8->id == TidyTag_BR || ((pDVar8 != (Dict *)0x0 && (pDVar8->id == TidyTag_HR)))))))) {
      uVar24 = prvTidyReadChar(doc->docIn);
      uVar11 = 10;
      if ((mode != IgnoreWhitespace && uVar24 == 10) ||
         ((BVar13 = yes, uVar24 != 10 && (uVar11 = uVar24, uVar24 != 0xc)))) {
        prvTidyUngetChar(uVar11,doc->docIn);
        BVar13 = yes;
      }
    }
    lexer->waswhite = BVar13;
    lexer->state = LEX_CONTENT;
    pNVar16 = lexer->token;
    if (pNVar16->tag == (Dict *)0x0) {
      if (mode != OtherNamespace) {
        if (((doc->lexer->doctype & 0x60000) == 0) ||
           (BVar13 = prvTidyelementIsAutonomousCustomFormat(pNVar16->element), BVar13 == no)) {
          pNVar16 = lexer->token;
          uVar11 = 0x28c;
        }
        else {
          pNVar16 = lexer->token;
          uVar11 = 0x28b;
        }
        prvTidyReport(doc,(Node *)0x0,pNVar16,uVar11);
      }
    }
    else {
      bVar25 = *(int *)((doc->config).value + 0x67) == 0;
      if (bVar25) {
        puVar1 = &doc->lexer->versions;
        *puVar1 = *puVar1 & (pNVar16->tag->versions | 0xe000);
      }
      prvTidyRepairDuplicateAttributes(doc,pNVar16,(uint)!bVar25);
    }
    goto LAB_0014ae35;
  case LEX_COMMENT:
    if (uVar14 == 0x2d) {
      uVar11 = prvTidyReadChar(doc->docIn);
      if (((uVar11 != 0x2d & bVar25) == 1) && (lexer->lexsize - lexer->txtstart == 1)) {
        lexer->lexbuf[lexer->lexsize - 1] = '=';
      }
      prvTidyAddCharToLexer(lexer,uVar11);
      if (uVar11 == 0x2d) {
        uVar11 = prvTidyReadChar(doc->docIn);
        do {
          if (uVar11 == 0x3e) {
            if (iVar12 != 0) {
              uVar14 = prvTidyHTMLVersion(doc);
              if ((uVar14 >> 0x11 & 1) == 0) {
                uVar11 = (uint)(bVar25 ^ 1U) + (uint)(bVar25 ^ 1U) * 2 + 0x24f;
              }
              else {
                uVar11 = 0x24f;
                if (bVar25 == false) goto LAB_0014a559;
              }
              prvTidyReport(doc,(Node *)0x0,(Node *)0x0,uVar11);
            }
LAB_0014a559:
            uVar14 = lexer->lexsize - 2;
            lexer->lexsize = uVar14;
            lexer->txtend = uVar14;
            lexer->lexbuf[uVar14] = '\0';
            lexer->state = LEX_CONTENT;
            lexer->waswhite = no;
            pNVar16 = NewToken(doc,CommentTag);
            lexer->token = pNVar16;
            uVar11 = prvTidyReadChar(doc->docIn);
            if (uVar11 == 10) {
              lexer->token->linebreak = yes;
            }
            else {
              prvTidyUngetChar(uVar11,doc->docIn);
            }
            goto LAB_0014ae35;
          }
          if (iVar12 == 0) {
            pSVar22 = doc->docIn;
            lexer->lines = pSVar22->curline;
            lexer->columns = pSVar22->curcol - 3;
          }
          if (bVar25 != false) {
            lexer->lexbuf[lexer->lexsize - 2] = '=';
          }
          iVar12 = iVar12 + 1;
          if (uVar11 != 0x2d) goto LAB_00149f46;
          prvTidyAddCharToLexer(lexer,0x2d);
          uVar11 = prvTidyReadChar(doc->docIn);
        } while( true );
      }
    }
    break;
  case LEX_DOCTYPE:
    prvTidyUngetChar(uVar14,doc->docIn);
    lexer->lexsize = lexer->lexsize - 1;
    lexer_00 = doc->lexer;
    uVar14 = lexer_00->lexsize;
    pNVar16 = (Node *)(*lexer_00->allocator->vtbl->alloc)(lexer_00->allocator,0x68);
    pNVar16->parent = (Node *)0x0;
    pNVar16->prev = (Node *)0x0;
    pNVar16->next = (Node *)0x0;
    pNVar16->content = (Node *)0x0;
    pNVar16->last = (Node *)0x0;
    pNVar16->attributes = (AttVal *)0x0;
    pNVar16->was = (Dict *)0x0;
    pNVar16->tag = (Dict *)0x0;
    pNVar16->element = (tmbstr)0x0;
    pNVar16->start = 0;
    pNVar16->end = 0;
    pNVar16->type = RootNode;
    pNVar16->line = 0;
    pNVar16->column = 0;
    pNVar16->closed = no;
    pNVar16->implicit = no;
    pNVar16->linebreak = no;
    if (lexer_00 != (Lexer *)0x0) {
      pNVar16->line = lexer_00->lines;
      pNVar16->column = lexer_00->columns;
    }
    pNVar16->type = DocTypeTag;
    pNVar16->start = lexer_00->txtstart;
    pNVar16->end = lexer_00->txtend;
    lexer_00->waswhite = no;
    uVar11 = prvTidyReadChar(doc->docIn);
    if (uVar11 == 0xffffffff) goto LAB_0014aa33;
    iVar12 = 1;
    local_58 = (tmbstr)CONCAT44(local_58._4_4_,1);
    goto LAB_0014a6ec;
  case LEX_PROCINSTR:
    if ((lexer->lexsize - lexer->txtstart == 3) &&
       (iVar15 = prvTidytmbstrncmp(lexer->lexbuf + lexer->txtstart,"php",3), iVar15 == 0)) {
      lexer->state = LEX_PHP;
    }
    else if ((lexer->lexsize - lexer->txtstart == 4) &&
            (((iVar15 = prvTidytmbstrncmp(lexer->lexbuf + lexer->txtstart,"xml",3), iVar15 == 0 &&
              (-1 < (long)lexer->lexbuf[lexer->txtstart + 3])) &&
             ((lexmap[lexer->lexbuf[lexer->txtstart + 3]] & 8) != 0)))) {
      lexer->state = LEX_XMLDECL;
      local_78 = (AttVal *)0x0;
    }
    else {
      if ((*(int *)((doc->config).value + 0x65) != 0) || (lexer->isvoyager != no)) {
        if (uVar14 != 0x3f) break;
        uVar14 = prvTidyReadChar(doc->docIn);
        if (uVar14 == 0xffffffff) {
          prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x284);
          goto LAB_00149f35;
        }
        prvTidyAddCharToLexer(lexer,uVar14);
      }
      if (uVar14 == 0x3e) {
        uVar11 = lexer->lexsize;
        uVar24 = uVar11 - 1;
        lexer->lexsize = uVar24;
        if (uVar24 == 0) {
          lexer->txtend = 0;
          *lexer->lexbuf = '\0';
          pNVar16 = NewToken(doc,ProcInsTag);
          lexer->token = pNVar16;
          goto LAB_0014ae2d;
        }
        uVar5 = lexer->txtstart;
        uVar17 = 0;
        if (uVar24 == uVar5) goto LAB_0014adcf;
        uVar17 = (ulong)((uVar24 - uVar5) + (uint)(uVar24 - uVar5 == 0));
        uVar23 = 0;
        goto LAB_0014ad14;
      }
    }
    break;
  case LEX_CDATA:
    if (uVar14 != 0x5d) break;
    uVar11 = prvTidyReadChar(doc->docIn);
    pSVar22 = doc->docIn;
    if (uVar11 != 0x5d) goto LAB_0014a28d;
    uVar11 = prvTidyReadChar(pSVar22);
    if (uVar11 == 0x3e) {
      uVar14 = lexer->lexsize - 1;
      lexer->lexsize = uVar14;
      lexer->txtend = uVar14;
      lexer->lexbuf[uVar14] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      type = CDATATag;
      goto LAB_0014a3dc;
    }
    prvTidyUngetChar(uVar11,doc->docIn);
    pSVar22 = doc->docIn;
    uVar11 = 0x5d;
    goto LAB_0014a28d;
  case LEX_SECTION:
    if (uVar14 == 0x3e) {
      prvTidyUngetChar(0x3e,doc->docIn);
    }
    else if (uVar14 != 0x5d) {
      if (((uVar14 == 0x5b) && (lexer->lexsize == lexer->txtstart + 6)) &&
         (iVar15 = prvTidytmbstrncmp(lexer->lexbuf + lexer->txtstart,"CDATA[",6), iVar15 == 0)) {
        lexer->state = LEX_CDATA;
        lexer->lexsize = lexer->lexsize - 6;
      }
      break;
    }
    uVar11 = prvTidyReadChar(doc->docIn);
    if (uVar11 == 0x2d) {
      uVar11 = prvTidyReadChar(doc->docIn);
      pSVar22 = doc->docIn;
      if (uVar11 == 0x2d) {
        uVar11 = prvTidyReadChar(pSVar22);
        if (uVar11 == 0x3e) goto LAB_0014ab68;
        prvTidyUngetChar(uVar11,doc->docIn);
        pSVar22 = doc->docIn;
        uVar11 = 0x2d;
      }
      prvTidyUngetChar(uVar11,pSVar22);
      pSVar22 = doc->docIn;
      uVar11 = 0x2d;
    }
    else {
      if (uVar11 == 0x3e) {
LAB_0014ab68:
        uVar14 = lexer->lexsize - 1;
        lexer->lexsize = uVar14;
        lexer->txtend = uVar14;
        lexer->lexbuf[uVar14] = '\0';
        lexer->state = LEX_CONTENT;
        lexer->waswhite = no;
        type = SectionTag;
        goto LAB_0014a3dc;
      }
LAB_0014a284:
      pSVar22 = doc->docIn;
    }
LAB_0014a28d:
    prvTidyUngetChar(uVar11,pSVar22);
    break;
  case LEX_ASP:
    if (uVar14 == 0x25) {
      uVar11 = prvTidyReadChar(doc->docIn);
      if (uVar11 != 0x3e) goto LAB_0014a284;
      uVar14 = lexer->lexsize - 1;
      lexer->lexsize = uVar14;
      lexer->txtend = uVar14;
      lexer->lexbuf[uVar14] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      type = AspTag;
      goto LAB_0014a3dc;
    }
    break;
  case LEX_JSTE:
    if (uVar14 == 0x23) {
      uVar11 = prvTidyReadChar(doc->docIn);
      if (uVar11 != 0x3e) goto LAB_0014a284;
      uVar14 = lexer->lexsize - 1;
      lexer->lexsize = uVar14;
      lexer->txtend = uVar14;
      lexer->lexbuf[uVar14] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      type = JsteTag;
      goto LAB_0014a3dc;
    }
    break;
  case LEX_PHP:
    if (uVar14 == 0x3f) {
      uVar11 = prvTidyReadChar(doc->docIn);
      if (uVar11 != 0x3e) goto LAB_0014a284;
      uVar14 = lexer->lexsize - 1;
      lexer->lexsize = uVar14;
      lexer->txtend = uVar14;
      lexer->lexbuf[uVar14] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      type = PhpTag;
      goto LAB_0014a3dc;
    }
    break;
  case LEX_XMLDECL:
    if (uVar14 < 0x80) {
      bVar9 = ((byte)lexmap[uVar14] & 8) >> 3;
    }
    else {
      bVar9 = 0;
    }
    if ((uVar14 == 0x3f) || (bVar9 == 0)) {
      if (uVar14 != 0x3f) {
        local_4c = 0;
        local_5c = no;
        prvTidyUngetChar(uVar14,doc->docIn);
        ptVar18 = ParseAttribute(doc,&local_5c,&local_38,&local_40);
        pNVar16 = local_38;
        if (ptVar18 == (tmbstr)0x0) {
          pAVar19 = local_78;
          if (local_38 != (Node *)0x0) {
            pAVar19 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
            pAVar19->asp = (Node *)0x0;
            pAVar19->php = (Node *)0x0;
            pAVar19->next = (AttVal *)0x0;
            pAVar19->dict = (Attribute *)0x0;
            *(undefined8 *)&pAVar19->delim = 0;
            pAVar19->attribute = (tmbstr)0x0;
            pAVar19->value = (tmbstr)0x0;
            pAVar19->asp = pNVar16;
            pAVar7 = local_78;
            if (local_78 != (AttVal *)0x0) {
              do {
                pAVar21 = pAVar7;
                pAVar7 = pAVar21->next;
              } while (pAVar7 != (AttVal *)0x0);
              pAVar21->next = pAVar19;
              pAVar19 = local_78;
            }
          }
          local_78 = pAVar19;
          pNVar16 = local_40;
          pAVar19 = local_78;
          if (local_40 != (Node *)0x0) {
            pAVar19 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
            pAVar19->asp = (Node *)0x0;
            pAVar19->php = (Node *)0x0;
            pAVar19->next = (AttVal *)0x0;
            pAVar19->dict = (Attribute *)0x0;
            *(undefined8 *)&pAVar19->delim = 0;
            pAVar19->attribute = (tmbstr)0x0;
            pAVar19->value = (tmbstr)0x0;
            pAVar19->php = pNVar16;
            pAVar7 = local_78;
            if (local_78 != (AttVal *)0x0) {
              do {
                pAVar21 = pAVar7;
                pAVar7 = pAVar21->next;
              } while (pAVar7 != (AttVal *)0x0);
              pAVar21->next = pAVar19;
              pAVar19 = local_78;
            }
          }
          local_78 = pAVar19;
          lexer->lexsize = lexer->lexsize - 1;
          lexer->txtend = lexer->txtstart;
          lexer->lexbuf[lexer->txtstart] = '\0';
          lexer->state = LEX_CONTENT;
          lexer->waswhite = no;
          unaff_R12 = NewToken(doc,XmlDecl);
          lexer->token = unaff_R12;
          unaff_R12->attributes = local_78;
          pAVar19 = local_78;
        }
        else {
          pAVar19 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
          *(undefined8 *)&pAVar19->delim = 0;
          pAVar19->attribute = (tmbstr)0x0;
          pAVar19->next = (AttVal *)0x0;
          pAVar19->dict = (Attribute *)0x0;
          pAVar19->asp = (Node *)0x0;
          pAVar19->php = (Node *)0x0;
          pAVar19->value = (tmbstr)0x0;
          pAVar19->attribute = ptVar18;
          local_58 = ptVar18;
          ptVar18 = ParseValue(doc,ptVar18,yes,&local_5c,&local_4c);
          pAVar19->value = ptVar18;
          pAVar19->delim = local_4c;
          pAVar20 = prvTidyFindAttribute(doc,pAVar19);
          pAVar19->dict = pAVar20;
          pAVar7 = local_78;
          ptVar18 = local_58;
          if (local_78 != (AttVal *)0x0) {
            do {
              pAVar21 = pAVar7;
              pAVar7 = pAVar21->next;
            } while (pAVar7 != (AttVal *)0x0);
            pAVar21->next = pAVar19;
            pAVar19 = local_78;
          }
        }
        local_78 = pAVar19;
        if (ptVar18 == (tmbstr)0x0) {
          return unaff_R12;
        }
      }
      uVar11 = prvTidyReadChar(doc->docIn);
      if (uVar11 == 0x3e) {
        lexer->lexsize = lexer->lexsize - 1;
        lexer->txtend = lexer->txtstart;
        lexer->lexbuf[lexer->txtstart] = '\0';
        lexer->state = LEX_CONTENT;
        lexer->waswhite = no;
        pNVar16 = NewToken(doc,XmlDecl);
        lexer->token = pNVar16;
        pNVar16->attributes = local_78;
        return pNVar16;
      }
      goto LAB_0014a284;
    }
  }
switchD_00149897_default:
  uVar14 = prvTidyReadChar(doc->docIn);
  if (uVar14 == 0xffffffff) goto LAB_0014a345;
  goto LAB_0014983a;
  while (uVar23 = uVar23 + 1, uVar17 != uVar23) {
LAB_0014ad14:
    if ((-1 < (long)lexer->lexbuf[uVar5 + (int)uVar23]) &&
       ((lexmap[lexer->lexbuf[uVar5 + (int)uVar23]] & 8) != 0)) {
      uVar17 = uVar23 & 0xffffffff;
      break;
    }
  }
LAB_0014adcf:
  uVar14 = uVar11 - 2;
  bVar25 = lexer->lexbuf[uVar14] == '?';
  if (bVar25) {
    lexer->lexsize = uVar14;
  }
  lexer->txtstart = uVar5 + (uint)uVar17;
  lexer->txtend = lexer->lexsize;
  lexer->lexbuf[lexer->lexsize] = '\0';
  pNVar16 = NewToken(doc,ProcInsTag);
  lexer->token = pNVar16;
  pNVar16->closed = (uint)bVar25;
  ptVar18 = prvTidytmbstrndup(doc->allocator,lexer->lexbuf + (lexer->txtstart - uVar17),(uint)uVar17
                             );
  lexer->token->element = ptVar18;
LAB_0014ae2d:
  lexer->state = LEX_CONTENT;
  lexer->waswhite = no;
  goto LAB_0014ae35;
LAB_00149f46:
  if (bVar25 != false) {
    lexer->lexbuf[lexer->lexsize - 1] = '=';
  }
  prvTidyAddCharToLexer(lexer,uVar11);
  goto switchD_00149897_default;
LAB_0014a6ec:
  do {
    uVar24 = uVar11;
    if (iVar12 != 4) {
      uVar24 = 0x20;
    }
    if (uVar11 != 10) {
      uVar24 = uVar11;
    }
    BVar13 = no;
    bVar9 = 0;
    if (uVar24 < 0x80) {
      bVar9 = ((byte)lexmap[uVar24] & 8) >> 3;
    }
    if ((iVar12 == 4) || (bVar9 == 0)) {
LAB_0014a73a:
      prvTidyAddCharToLexer(lexer_00,uVar24);
      lexer_00->waswhite = BVar13;
      if ((((uVar24 < 0x80) && ((lexmap[uVar24] & 8) != 0)) || (uVar24 == 0x5b)) ||
         (iVar12 = 1, uVar24 == 0x3e)) {
        ptVar18 = prvTidytmbstrndup(doc->allocator,lexer_00->lexbuf + (int)uVar14,
                                    ~uVar14 + lexer_00->lexsize);
        pNVar16->element = ptVar18;
        iVar12 = 0;
        if ((uVar24 == 0x5b) || (uVar24 == 0x3e)) {
          lexer_00->lexsize = lexer_00->lexsize - 1;
          prvTidyUngetChar(uVar24,doc->docIn);
        }
      }
    }
    else if (lexer_00->waswhite == no) {
      BVar13 = yes;
      goto LAB_0014a73a;
    }
    uVar11 = prvTidyReadChar(doc->docIn);
  } while (uVar11 != 0xffffffff);
LAB_0014aa33:
  prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x253);
  prvTidyFreeNode(doc,pNVar16);
  lexer->token = (Node *)0x0;
  lexer->txtend = lexer->lexsize;
  lexer->lexbuf[lexer->lexsize] = '\0';
  lexer->state = LEX_CONTENT;
  lexer->waswhite = no;
  if (((lexer->doctype == 0) && (lexer->token != (Node *)0x0)) &&
     (*(int *)((doc->config).value + 0x67) == 0)) {
    uVar11 = FindGivenVersion(doc,lexer->token);
    lexer->doctype = uVar11;
    if (uVar11 != 0x60000) {
      prvTidyAdjustTags(doc);
    }
  }
LAB_0014ae35:
  return lexer->token;
}

Assistant:

Node* TY_(GetToken)( TidyDocImpl* doc, GetTokenMode mode )
{
    Node *node;
    Lexer* lexer = doc->lexer;

    if (lexer->pushed || lexer->itoken)
    {
        /* Deal with previously returned duplicate inline token */
        if (lexer->itoken)
        {
            /* itoken rejected */
            if (lexer->pushed)
            {
                lexer->pushed = no;
                node = lexer->itoken;
                GTDBG(doc,"lex-itoken", node);
                return node;
            }
            /* itoken has been accepted */
            lexer->itoken = NULL;
        }
            
        /* duplicate inlines in preference to pushed text nodes when appropriate */
        lexer->pushed = no;
        if (lexer->token->type != TextNode
            || !(lexer->insert || lexer->inode)) {
            node = lexer->token;
            GTDBG(doc,"lex-token", node);
            return node;
        }
        lexer->itoken = TY_(InsertedToken)( doc );
        node = lexer->itoken;
        GTDBG(doc,"lex-inserted", node);
        return node;
    }

    assert( !(lexer->pushed || lexer->itoken) );

    /* at start of block elements, unclosed inline
       elements are inserted into the token stream 
       Issue #341 - Can NOT insert a token if NO istacksize  
     */
    if ((lexer->insert || lexer->inode) && lexer->istacksize)
    {
        /*\ Issue #92: could fix by the following, but instead chose not to stack these 2
         *  if ( !(lexer->insert && (nodeIsINS(lexer->insert) || nodeIsDEL(lexer->insert))) ) {
        \*/
        lexer->token = TY_(InsertedToken)( doc );
        node = lexer->token;
        GTDBG(doc,"lex-inserted2", node);
        return node;
    }

    if (mode == CdataContent)
    {
        assert( lexer->parent != NULL );
        node = GetCDATA(doc, lexer->parent);
        GTDBG(doc,"lex-cdata", node);
        return node;
    }

    return GetTokenFromStream( doc, mode );
}